

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O2

void __thiscall ipx::SparseMatrix::add_column(SparseMatrix *this)

{
  int iVar1;
  pointer __src;
  pointer __src_00;
  size_t sVar2;
  Int nznew;
  value_type_conflict2 local_14;
  
  iVar1 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  reserve(this,(int)((ulong)((long)(this->rowidx_queue_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->rowidx_queue_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2) + iVar1);
  __src = (this->rowidx_queue_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  sVar2 = (long)(this->rowidx_queue_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)__src;
  if (sVar2 != 0) {
    memmove((this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + iVar1,__src,sVar2);
  }
  __src_00 = (this->values_queue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  sVar2 = (long)(this->values_queue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)__src_00;
  if (sVar2 != 0) {
    memmove((this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + iVar1,__src_00,sVar2);
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->colptr_,&local_14);
  clear_queue(this);
  return;
}

Assistant:

void SparseMatrix::add_column() {
    Int nz = entries();
    Int nznew = nz + queue_size();
    reserve(nznew);
    std::copy(rowidx_queue_.begin(), rowidx_queue_.end(), rowidx_.begin() + nz);
    std::copy(values_queue_.begin(), values_queue_.end(), values_.begin() + nz);
    colptr_.push_back(nznew);
    clear_queue();
}